

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void fl_fix_focus(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Window *pFVar4;
  Fl_Group *pFVar5;
  Fl_Widget *pFVar6;
  int old_event_1;
  int old_event;
  int saved;
  Fl_Widget *w;
  
  pFVar4 = Fl::grab();
  iVar3 = Fl::e_keysym;
  if (pFVar4 == (Fl_Window *)0x0) {
    _old_event = fl_xfocus;
    if (fl_xfocus == (Fl_Window *)0x0) {
      Fl::focus((Fl_Widget *)0x0);
      iVar3 = Fl::e_keysym;
    }
    else {
      if ((Fl::e_keysym < 0xfee9) || (0xfeeb < Fl::e_keysym)) {
        Fl::e_keysym = 0;
      }
      while (pFVar5 = Fl_Widget::parent((Fl_Widget *)_old_event), pFVar5 != (Fl_Group *)0x0) {
        _old_event = (Fl_Window *)Fl_Widget::parent((Fl_Widget *)_old_event);
      }
      pFVar4 = Fl::modal();
      if (pFVar4 != (Fl_Window *)0x0) {
        _old_event = Fl::modal();
      }
      pFVar6 = Fl::focus();
      iVar1 = Fl_Widget::contains((Fl_Widget *)_old_event,pFVar6);
      if ((iVar1 == 0) && (iVar1 = Fl_Widget::take_focus((Fl_Widget *)_old_event), iVar1 == 0)) {
        Fl::focus((Fl_Widget *)_old_event);
      }
    }
    Fl::e_keysym = iVar3;
    pFVar6 = Fl::pushed();
    if (pFVar6 == (Fl_Widget *)0x0) {
      _old_event = fl_xmousewin;
      if (fl_xmousewin == (Fl_Window *)0x0) {
        Fl::belowmouse((Fl_Widget *)0x0);
        (*Fl_Tooltip::enter)((Fl_Widget *)0x0);
      }
      else {
        pFVar4 = Fl::modal();
        if (pFVar4 != (Fl_Window *)0x0) {
          _old_event = Fl::modal();
        }
        pFVar6 = Fl::belowmouse();
        iVar2 = Fl_Widget::contains((Fl_Widget *)_old_event,pFVar6);
        iVar1 = Fl::e_x_root;
        iVar3 = Fl::e_number;
        if (iVar2 == 0) {
          Fl::e_number = 3;
          (*(_old_event->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(_old_event,3);
          Fl::e_number = iVar3;
          pFVar6 = Fl::belowmouse();
          iVar3 = Fl_Widget::contains((Fl_Widget *)_old_event,pFVar6);
          if (iVar3 == 0) {
            Fl::belowmouse((Fl_Widget *)_old_event);
          }
        }
        else {
          iVar3 = Fl_Widget::x((Fl_Widget *)fl_xmousewin);
          iVar2 = Fl::e_y_root;
          Fl::e_x = iVar1 - iVar3;
          iVar1 = Fl_Widget::y((Fl_Widget *)fl_xmousewin);
          iVar3 = Fl::e_number;
          Fl::e_y = iVar2 - iVar1;
          Fl::e_number = 0xb;
          (*(_old_event->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(_old_event,0xb);
          Fl::e_number = iVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void fl_fix_focus() {
#ifdef DEBUG
  puts("fl_fix_focus();");
#endif // DEBUG

  if (Fl::grab()) return; // don't do anything while grab is on.

  // set focus based on Fl::modal() and fl_xfocus
  Fl_Widget* w = fl_xfocus;
  if (w) {
    int saved = Fl::e_keysym;
    if (Fl::e_keysym < (FL_Button + FL_LEFT_MOUSE) ||
        Fl::e_keysym > (FL_Button + FL_RIGHT_MOUSE))
      Fl::e_keysym = 0; // make sure widgets don't think a keystroke moved focus
    while (w->parent()) w = w->parent();
    if (Fl::modal()) w = Fl::modal();
    if (!w->contains(Fl::focus()))
      if (!w->take_focus()) Fl::focus(w);
    Fl::e_keysym = saved;
  } else
    Fl::focus(0);

// MRS: Originally we checked the button state, but a user reported that it
//      broke click-to-focus in FLWM?!?
//  if (!(Fl::event_state() & 0x7f00000 /*FL_BUTTONS*/)) {
  if (!Fl::pushed()) {
    // set belowmouse based on Fl::modal() and fl_xmousewin:
    w = fl_xmousewin;
    if (w) {
      if (Fl::modal()) w = Fl::modal();
      if (!w->contains(Fl::belowmouse())) {
        int old_event = Fl::e_number;
	w->handle(Fl::e_number = FL_ENTER);
	Fl::e_number = old_event;
	if (!w->contains(Fl::belowmouse())) Fl::belowmouse(w);
      } else {
	// send a FL_MOVE event so the enter/leave state is up to date
	Fl::e_x = Fl::e_x_root-fl_xmousewin->x();
	Fl::e_y = Fl::e_y_root-fl_xmousewin->y();
        int old_event = Fl::e_number;
	w->handle(Fl::e_number = FL_MOVE);
	Fl::e_number = old_event;
      }
    } else {
      Fl::belowmouse(0);
      Fl_Tooltip::enter(0);
    }
  }
}